

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

void __thiscall
compressed_sparse_matrix<filtration_entry_t>::append_column
          (compressed_sparse_matrix<filtration_entry_t> *this)

{
  _Map_pointer ppfVar1;
  unsigned_long local_8;
  
  ppfVar1 = (this->entries).
            super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  local_8 = ((long)(this->entries).
                   super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(this->entries).
                   super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
            ((long)(this->entries).
                   super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this->entries).
                   super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
            ((((ulong)((long)ppfVar1 -
                      (long)(this->entries).
                            super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(ppfVar1 == (_Map_pointer)0x0)) * 0x20;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->bounds,&local_8);
  return;
}

Assistant:

void append_column() { bounds.push_back(entries.size()); }